

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

State * __thiscall despot::RegDemo::CreateStartState(RegDemo *this,string *type)

{
  State *this_00;
  double dVar1;
  double prob;
  string *type_local;
  RegDemo *this_local;
  
  dVar1 = (double)despot::Random::NextDouble();
  this_00 = (State *)operator_new(0x20);
  RegDemoState::RegDemoState((RegDemoState *)this_00,(uint)(0.5 < dVar1));
  return this_00;
}

Assistant:

State* RegDemo::CreateStartState(string type) const {
	double prob = Random::RANDOM.NextDouble();
	return new RegDemoState((prob <= 0.5) ? 0 : 1);
}